

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O3

void __thiscall position::do_move(position *this,Move *m)

{
  U64 *pUVar1;
  U16 *pUVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  undefined2 uVar6;
  ushort uVar7;
  Color CVar8;
  U64 UVar9;
  long lVar10;
  uint uVar11;
  Color *pCVar12;
  byte bVar13;
  info *piVar14;
  Color *pCVar15;
  bool *pbVar16;
  info *ifo;
  ulong uVar17;
  Square SVar18;
  Color them;
  Piece cap;
  Color us;
  Square to;
  Square from;
  Piece p;
  Color local_58;
  Color local_54;
  Color local_50;
  Square local_4c;
  Square local_48;
  Color local_44;
  info *local_40;
  Color local_38;
  Color local_34;
  
  pCVar12 = &local_58;
  ifo = &this->ifo;
  UVar9 = this->hidx;
  this->hidx = UVar9 + 1;
  pbVar16 = &this->history[UVar9 - 1].incheck;
  piVar14 = ifo;
  for (lVar10 = 0xc; pbVar16 = pbVar16 + 8, lVar10 != 0; lVar10 = lVar10 + -1) {
    *(U64 *)pbVar16 = piVar14->checkers;
    piVar14 = (info *)piVar14->pinned;
  }
  bVar4 = m->f;
  local_48 = (Square)bVar4;
  bVar3 = m->t;
  local_4c = (Square)bVar3;
  bVar13 = m->type;
  local_38 = (this->pcs).piece_on._M_elems[bVar4];
  CVar8 = (this->ifo).stm;
  uVar17 = (ulong)CVar8;
  SVar18 = (Square)bVar3;
  local_50 = CVar8;
  if (local_38 == no_color) {
    if (uVar17 == 1) {
      uVar7 = (this->ifo).cmask;
      if ((uVar7 & 0xc) != 0) {
        if (local_48 == H8) {
          (this->ifo).cmask = uVar7 & 0xb;
          local_58 = black;
          local_54 = CONCAT22(local_54._2_2_,0xb);
          local_40 = ifo;
          UVar9 = zobrist::castle(&local_58,(U16 *)&local_54);
          pUVar1 = &(this->ifo).key;
          *pUVar1 = *pUVar1 ^ UVar9;
          local_58 = black;
          uVar6 = 0xb;
        }
        else {
          if (bVar4 != 0x38) goto LAB_00120aea;
          (this->ifo).cmask = uVar7 & 7;
          local_58 = black;
          local_54 = CONCAT22(local_54._2_2_,7);
          local_40 = ifo;
          UVar9 = zobrist::castle(&local_58,(U16 *)&local_54);
          pUVar1 = &(this->ifo).key;
          *pUVar1 = *pUVar1 ^ UVar9;
          local_58 = black;
          uVar6 = 7;
        }
        goto LAB_00120acc;
      }
    }
    else if ((CVar8 == white) && (uVar7 = (this->ifo).cmask, (uVar7 & 3) != 0)) {
      if (bVar4 == 7) {
        (this->ifo).cmask = uVar7 & 0xe;
        local_58 = white;
        local_54 = CONCAT22(local_54._2_2_,0xe);
        local_40 = ifo;
        UVar9 = zobrist::castle(&local_58,(U16 *)&local_54);
        pUVar1 = &(this->ifo).key;
        *pUVar1 = *pUVar1 ^ UVar9;
        local_58 = white;
        uVar6 = 0xe;
      }
      else {
        if (bVar4 != 0) goto LAB_00120aea;
        (this->ifo).cmask = uVar7 & 0xd;
        local_58 = white;
        local_54 = CONCAT22(local_54._2_2_,0xd);
        local_40 = ifo;
        UVar9 = zobrist::castle(&local_58,(U16 *)&local_54);
        pUVar1 = &(this->ifo).key;
        *pUVar1 = *pUVar1 ^ UVar9;
        local_58 = white;
        uVar6 = 0xd;
      }
LAB_00120acc:
      local_54 = CONCAT22(local_54._2_2_,uVar6);
      UVar9 = zobrist::castle(&local_58,(U16 *)&local_54);
      pUVar1 = &(this->ifo).repkey;
      *pUVar1 = *pUVar1 ^ UVar9;
      ifo = local_40;
    }
  }
  else if (local_38 == 5) {
    (this->pcs).king_sq._M_elems[uVar17] = local_4c;
    (this->ifo).ks[uVar17] = SVar18;
    uVar7 = (this->ifo).cmask;
    if (((uint)(uVar17 == 0) * 3 - 5 | (uint)uVar7) != 0xffffffff) {
      uVar11 = 0xfffffff7;
      if (uVar17 == 0) {
        uVar11 = 0xfffffffd;
      }
      if ((uVar11 | uVar7) != 0xffffffff) goto LAB_00120aea;
    }
    (this->ifo).cmask = uVar7 & (ushort)(uVar17 == 0) * 9 + 3;
    if (uVar17 == 0) {
      local_58 = white;
      local_44._0_2_ = 0xc;
      local_40 = ifo;
      UVar9 = zobrist::castle(&local_58,(U16 *)&local_44);
      pUVar1 = &(this->ifo).key;
      *pUVar1 = *pUVar1 ^ UVar9;
      local_58 = white;
      local_44 = CONCAT22(local_44._2_2_,0xc);
      pCVar15 = &local_44;
    }
    else {
      local_54 = black;
      local_34._0_2_ = no_color;
      local_40 = ifo;
      UVar9 = zobrist::castle(&local_54,(U16 *)&local_34);
      pUVar1 = &(this->ifo).key;
      *pUVar1 = *pUVar1 ^ UVar9;
      local_54 = black;
      local_34 = CONCAT22(local_34._2_2_,3);
      pCVar12 = &local_54;
      pCVar15 = &local_34;
    }
    UVar9 = zobrist::castle(pCVar12,(U16 *)pCVar15);
    pUVar1 = &(this->ifo).repkey;
    *pUVar1 = *pUVar1 ^ UVar9;
    ifo = local_40;
  }
LAB_00120aea:
  (this->ifo).captured = no_piece;
  if (bVar13 == 0xc) {
    local_40 = (info *)CONCAT44(local_40._4_4_,0xc);
    (this->ifo).captured = pawn;
    local_58 = CVar8 ^ black;
    local_54 = ((uint)(uVar17 == 1) * 0x10 + SVar18) - 8;
    local_44 = white;
    piece_data::remove_piece(&this->pcs,&local_58,&local_44,&local_54,ifo);
    local_44 = white;
    pCVar12 = &local_44;
    bVar13 = (byte)local_40;
LAB_00120bf1:
    piece_data::do_quiet(&this->pcs,&local_50,pCVar12,&local_48,&local_4c,ifo);
  }
  else {
    if (bVar13 == 0xb) {
      local_54 = (this->pcs).piece_on._M_elems[bVar3];
      (this->ifo).captured = local_54;
      local_58 = CVar8 ^ black;
      piece_data::remove_piece(&this->pcs,&local_58,&local_54,&local_4c,ifo);
      pCVar12 = &local_38;
      goto LAB_00120bf1;
    }
    if (bVar13 == 10) {
      pCVar12 = &local_38;
      goto LAB_00120bf1;
    }
    if (bVar13 < 4) {
      if (bVar13 == 0) {
        local_54 = 4;
      }
      else if (bVar13 == 1) {
        local_54 = no_color;
      }
      else {
        local_54 = (bVar13 == 2) + black;
      }
      pCVar12 = &local_54;
      local_58 = white;
      piece_data::remove_piece(&this->pcs,&local_50,&local_58,&local_48,ifo);
LAB_00120fa1:
      piece_data::add_piece(&this->pcs,&local_50,pCVar12,&local_4c,ifo);
    }
    else {
      if (bVar13 < 8) {
        local_54 = (this->pcs).piece_on._M_elems[SVar18];
        (this->ifo).captured = local_54;
        if (bVar13 == 4) {
          local_34 = 4;
        }
        else if (bVar13 == 5) {
          local_34 = no_color;
        }
        else {
          local_34 = (bVar13 == 6) + black;
        }
        local_58 = CVar8 ^ black;
        piece_data::remove_piece(&this->pcs,&local_58,&local_54,&local_4c,ifo);
        local_44 = white;
        piece_data::remove_piece(&this->pcs,&local_50,&local_44,&local_48,ifo);
        pCVar12 = &local_34;
        goto LAB_00120fa1;
      }
      if (bVar13 == 9) {
        local_58 = 0x38;
        if (uVar17 == 0) {
          local_58 = white;
        }
        CVar8 = no_color;
        local_54 = 0x3b;
LAB_00120eb8:
        if (uVar17 == 0) {
          local_54 = CVar8;
        }
        local_44 = 5;
        piece_data::do_quiet(&this->pcs,&local_50,&local_44,&local_48,&local_4c,ifo);
        local_44 = no_color;
        piece_data::do_quiet(&this->pcs,&local_50,&local_44,&local_58,&local_54,ifo);
        pUVar2 = &(this->ifo).cmask;
        *pUVar2 = *pUVar2 & (ushort)((ulong)local_50 == 0) * 9 + 3;
        (this->ifo).has_castled[local_50] = true;
      }
      else if (bVar13 == 8) {
        local_58 = 0x3f;
        if (uVar17 == 0) {
          local_58 = 7;
        }
        CVar8 = 5;
        local_54 = 0x3d;
        goto LAB_00120eb8;
      }
    }
  }
  pCVar12 = &(this->ifo).stm;
  (this->ifo).eps = no_square;
  if (local_38 == white) {
    if (((local_48 - local_4c) + 0x10 & 0xffffffdf) == 0) {
      (this->ifo).eps = (local_48 + (uint)(local_50 == white) * 0x10) - A2;
      local_58 = CONCAT31(local_58._1_3_,(char)local_4c) & 0xffffff07;
      UVar9 = zobrist::ep((U8 *)&local_58);
      pUVar1 = &(this->ifo).key;
      *pUVar1 = *pUVar1 ^ UVar9;
      local_58 = CONCAT31(local_58._1_3_,(undefined1)local_4c) & 0xffffff07;
      UVar9 = zobrist::ep((U8 *)&local_58);
      pUVar1 = &(this->ifo).repkey;
      *pUVar1 = *pUVar1 ^ UVar9;
      bVar5 = local_38 == white;
      goto LAB_00120c78;
    }
  }
  else {
    bVar5 = false;
LAB_00120c78:
    if (!(bool)(bVar13 == 0xb | bVar5)) {
      bVar4 = (this->ifo).move50 + 1;
      (this->ifo).move50 = bVar4;
      uVar7 = (ushort)bVar4;
      goto LAB_00120ca2;
    }
  }
  (this->ifo).move50 = '\0';
  uVar7 = 0;
LAB_00120ca2:
  local_58 = CONCAT22(local_58._2_2_,uVar7);
  UVar9 = zobrist::mv50((U16 *)&local_58);
  pUVar1 = &(this->ifo).key;
  *pUVar1 = *pUVar1 ^ UVar9;
  pUVar2 = &(this->ifo).hmvs;
  *pUVar2 = *pUVar2 + 1;
  UVar9 = zobrist::hmvs(&(this->ifo).hmvs);
  pUVar1 = &(this->ifo).key;
  *pUVar1 = *pUVar1 ^ UVar9;
  pCVar15 = &(this->ifo).stm;
  *(undefined1 *)pCVar15 = (char)*pCVar15 ^ black;
  UVar9 = zobrist::stm(pCVar12);
  pUVar1 = &(this->ifo).key;
  *pUVar1 = *pUVar1 ^ UVar9;
  UVar9 = zobrist::stm(pCVar12);
  pUVar1 = &(this->ifo).repkey;
  *pUVar1 = *pUVar1 ^ UVar9;
  local_58 = (this->ifo).ks[(this->ifo).stm];
  UVar9 = 0;
  bVar5 = is_attacked(this,&local_58,pCVar12,&local_50,0);
  (this->ifo).incheck = bVar5;
  if (bVar5) {
    CVar8 = (this->ifo).stm;
    local_58 = (this->ifo).ks[CVar8];
    local_54 = CVar8 ^ black;
    UVar9 = attackers_of2(this,&local_58,&local_54);
  }
  (this->ifo).checkers = UVar9;
  CVar8 = (this->ifo).stm;
  UVar9 = pinned(this,CVar8);
  (this->ifo).pinned[CVar8] = UVar9;
  UVar9 = pinned(this,(Color)((long)(int)CVar8 ^ 1U));
  (this->ifo).pinned[(long)(int)CVar8 ^ 1U] = UVar9;
  this->nodes_searched = this->nodes_searched + 1;
  return;
}

Assistant:

void position::do_move(const Move& m) {
	history[hidx++] = ifo;
	const Square from = Square(m.f);
	const Square to = Square(m.t);
	const Movetype t = Movetype(m.type);
	const Piece p = piece_on(from);
	const Color us = to_move();

	// king square update and castle rights update
	if (p == king) {
		pcs.king_sq[us] = to;
		ifo.ks[us] = to;
		if (can_castle_ks() || can_castle_qs()) {
			ifo.cmask &= (us == white ? clearw : clearb);
			ifo.key ^= (us == white ? zobrist::castle(white, clearw) : zobrist::castle(black, clearb));
			ifo.repkey ^= (us == white ? zobrist::castle(white, clearw) : zobrist::castle(black, clearb));
		}
	}
	else if (p == rook) {
		if (us == white && can_castle<white>()) {
			if (from == A1) {
				ifo.cmask &= clearwqs;
				ifo.key ^= zobrist::castle(white, clearwqs);
				ifo.repkey ^= zobrist::castle(white, clearwqs);
			}
			else if (from == H1) {
				ifo.cmask &= clearwks;
				ifo.key ^= zobrist::castle(white, clearwks);
				ifo.repkey ^= zobrist::castle(white, clearwks);
			}
		}
		else if (us == black && can_castle<black>()) {
			if (from == A8) {
				ifo.cmask &= clearbqs;
				ifo.key ^= zobrist::castle(black, clearbqs);
				ifo.repkey ^= zobrist::castle(black, clearbqs);
			}
			else if (from == H8) {
				ifo.cmask &= clearbks;
				ifo.key ^= zobrist::castle(black, clearbks);
				ifo.repkey ^= zobrist::castle(black, clearbks);
			}
		}
	}

	ifo.captured = no_piece;

	if (t == quiet) {
		pcs.do_quiet(us, p, from, to, ifo);
	}

	else if (t == capture) {
		ifo.captured = piece_on(to);
		pcs.do_cap(us, p, from, to, ifo);
	}

	else if (t == ep) {
		ifo.captured = pawn;
		pcs.do_ep(us, from, to, ifo);
	}

	else if (t < capture_promotion_q) pcs.do_promotion(us, (t == promotion_q ? queen :
		t == promotion_r ? rook :
		t == promotion_b ? bishop :
		knight), from, to, ifo);

	else if (t < castle_ks) {
		ifo.captured = piece_on(to);
		pcs.do_promotion_cap(us, (t == capture_promotion_q ? queen :
			t == capture_promotion_r ? rook :
			t == capture_promotion_b ? bishop :
			knight), from, to, ifo);
	}

	else if (t == castle_ks) {
		pcs.do_castle_ks(us, from, to, ifo);
		ifo.cmask &= (us == white ? clearw : clearb);
		ifo.has_castled[us] = true;
	}

	else if (t == castle_qs) {
		pcs.do_castle_qs(us, from, to, ifo);
		ifo.cmask &= (us == white ? clearw : clearb);
		ifo.has_castled[us] = true;
	}

	// eps
	ifo.eps = no_square;
	if (p == pawn && abs(from - to) == 16) {
		ifo.eps = Square(from + (us == white ? 8 : -8));
		ifo.key ^= zobrist::ep(util::col(to));
		ifo.repkey ^= zobrist::ep(util::col(to));
	}

	// move50
	if (p == pawn || t == capture) ifo.move50 = 0;
	else ifo.move50++;
	ifo.key ^= zobrist::mv50(ifo.move50);

	// half-moves
	ifo.hmvs++;
	ifo.key ^= zobrist::hmvs(ifo.hmvs);

	// side to move
	ifo.stm = Color(ifo.stm ^ 1);
	ifo.key ^= zobrist::stm(ifo.stm);
	ifo.repkey ^= zobrist::stm(ifo.stm);

	ifo.incheck = is_attacked(king_square(), ifo.stm, us);
	ifo.checkers = (ifo.incheck ? attackers_of2(king_square(), Color(ifo.stm ^ 1)) : 0ULL);
	ifo.pinned[ifo.stm] = pinned(ifo.stm);
	ifo.pinned[ifo.stm ^ 1] = pinned(Color(ifo.stm ^ 1));
	++nodes_searched;
}